

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  char **ppcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  ostream *poVar8;
  ulong uVar9;
  char **__args_2;
  ulong uVar10;
  allocator<char> local_109;
  string command_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char **local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string help_string;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Usage: ",(allocator<char> *)&local_90);
  std::operator+(&local_d8,&local_b0,*argv);
  std::operator+(&command_str,&local_d8," [-h | --help] [--version] <command> [<args>]\n\n");
  std::operator+(&help_string,&command_str,"Available commands are:\n");
  local_b8 = argv;
  std::__cxx11::string::~string((string *)&command_str);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar4 = getMaxCommandLen<std::__cxx11::string,Command>(&commands_abi_cxx11_);
  for (p_Var6 = commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    p_Var1 = p_Var6[1]._M_parent;
    std::operator+(&local_90,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                  );
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,((char)iVar4 + '\x03') - (char)p_Var1);
    std::operator+(&local_b0,&local_90,&local_70);
    std::operator+(&local_d8,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 2)
                  );
    std::operator+(&command_str,&local_d8,"\n");
    std::__cxx11::string::append((string *)&help_string);
    std::__cxx11::string::~string((string *)&command_str);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\n",&local_109);
  std::operator+(&local_90,&local_70,"If no command is given, \'ls\' is assumed.\n");
  ppcVar2 = local_b8;
  std::operator+(&local_b0,&local_90,"See \'");
  std::operator+(&local_d8,&local_b0,*ppcVar2);
  std::operator+(&command_str,&local_d8," <command> --help\' for command-specific help.");
  std::__cxx11::string::append((string *)&help_string);
  std::__cxx11::string::~string((string *)&command_str);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command_str,"ls",(allocator<char> *)&local_d8);
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
          ::find(&commands_abi_cxx11_._M_t,&command_str);
  std::__cxx11::string::~string((string *)&command_str);
  iVar4 = argc + -1;
  __args_2 = ppcVar2 + 1;
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&command_str,*__args_2,(allocator<char> *)&local_d8);
    bVar3 = std::operator==(&command_str,"--help");
    if (bVar3) {
LAB_00110111:
      poVar8 = std::operator<<((ostream *)&std::cout,(string *)&help_string);
LAB_00110125:
      std::endl<char,std::char_traits<char>>(poVar8);
      bVar3 = false;
    }
    else {
      bVar3 = std::operator==(&command_str,"-h");
      if (bVar3) goto LAB_00110111;
      bVar3 = std::operator==(&command_str,"--version");
      if (bVar3) {
        poVar8 = std::operator<<((ostream *)&std::cout,"2.0.1");
        goto LAB_00110125;
      }
      bVar3 = true;
      if ((command_str._M_string_length != 0) && (*command_str._M_dataplus._M_p != '-')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,*__args_2,(allocator<char> *)&local_b0);
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
                ::find(&commands_abi_cxx11_._M_t,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        iVar4 = argc + -2;
        __args_2 = ppcVar2 + 2;
      }
    }
    std::__cxx11::string::~string((string *)&command_str);
    iVar5 = 0;
    if (!bVar3) goto LAB_00110212;
  }
  if ((_Rb_tree_header *)cVar7._M_node == &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::operator<<((ostream *)&std::cerr,"Invalid command\n");
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&help_string);
    std::operator<<(poVar8,'\n');
    iVar5 = 1;
  }
  else {
    command_str._M_dataplus._M_p = (pointer)&command_str.field_2;
    command_str._M_string_length = 0;
    command_str.field_2._M_local_buf[0] = '\0';
    uVar10 = 0;
    uVar9 = (ulong)(uint)(argc - iVar4);
    if (argc - iVar4 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      if (command_str._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&command_str);
      }
      std::__cxx11::string::append((char *)&command_str);
    }
    iVar5 = std::
            function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_char_**)>
            ::operator()((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_char_**)>
                          *)(cVar7._M_node + 3),&command_str,iVar4,__args_2);
    std::__cxx11::string::~string((string *)&command_str);
  }
LAB_00110212:
  std::__cxx11::string::~string((string *)&help_string);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
  WSA wsa;

  std::string help_string = std::string("Usage: ") +
      argv[0] + " [-h | --help] [--version] <command> [<args>]\n\n" +
      "Available commands are:\n";

  const int max_command_len = getMaxCommandLen(commands);
  for (const auto &cmd : commands)
  {
    const int min_padding = 3;
    const int padding =
        max_command_len + min_padding - static_cast<int>(cmd.first.length());
    help_string += "    " + cmd.first +
                   std::string(static_cast<std::size_t>(padding), ' ') +
                   cmd.second.description + "\n";
  }

  help_string += std::string("\n") +
      "If no command is given, 'ls' is assumed.\n" +
      "See '" + argv[0] + " <command> --help' for command-specific help.";

  auto command = commands.find("ls");

  int argc_subcommand = argc - 1;
  char **argv_subcommand = argv + 1;

  if (argc > 1)
  {
    const std::string argv_1(argv[1]);
    if (argv_1 == "--help" || argv_1 == "-h")
    {
      std::cout << help_string << std::endl;
      return 0;
    }
    if (argv_1 == "--version")
    {
      std::cout << PACKAGE_VERSION << std::endl;
      return 0;
    }

    if (!argv_1.empty() && argv_1[0] != '-')
    {
      command = commands.find(argv[1]);
      --argc_subcommand;
      ++argv_subcommand;
    }
  }

  if (command == commands.end())
  {
    std::cerr << "Invalid command\n";
    std::cerr << help_string << '\n';
    return 1;
  }

  std::string command_str;
  for (int i = 0; i < (argc - argc_subcommand); ++i)
  {
    if (!command_str.empty())
    { command_str += ' '; }
    command_str += argv[i];
  }

  return command->second.fun(command_str, argc_subcommand, argv_subcommand);
}